

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

void unp::ErrorDoIt(int errnoFlag,int level,char *fmt,__va_list_tag *ap)

{
  int __errnum;
  int *piVar1;
  size_t sVar2;
  char *pcVar3;
  char local_1038 [8];
  char buf [4097];
  int n;
  int errnoSave;
  __va_list_tag *ap_local;
  char *fmt_local;
  int level_local;
  int errnoFlag_local;
  
  piVar1 = __errno_location();
  __errnum = *piVar1;
  vsnprintf(local_1038,0x1000,fmt,ap);
  sVar2 = strlen(local_1038);
  if (errnoFlag != 0) {
    pcVar3 = strerror(__errnum);
    snprintf(local_1038 + (int)sVar2,(long)(0x1001 - (int)sVar2),": %s",pcVar3);
  }
  strncat(local_1038,"\n",1);
  if (daemonProc == 0) {
    fflush(_stdout);
    fputs(local_1038,_stderr);
    fflush(_stderr);
  }
  else {
    vsyslog(level,local_1038,ap);
  }
  return;
}

Assistant:

inline void unp::ErrorDoIt( int errnoFlag, int level, const char *fmt, va_list ap ) {
    int errnoSave, n;
    char buf[MAXLINE + 1];

    errnoSave = errno;
    std::vsnprintf( buf, MAXLINE, fmt, ap );     // don't make sense to still check if snprintf is available

    n = strlen( buf );
    // get error string if it related to system call error
    if ( errnoFlag ) {
        std::snprintf( buf + n, MAXLINE - n + 1, ": %s", strerror( errnoSave ) );
    }
    std::strncat( buf, "\n", 1 );

    if ( daemonProc ) {
        vsyslog( level, buf, ap );
    } else {
        std::fflush( stdout );
        std::fputs( buf, stderr );
        std::fflush( stderr );
    }
}